

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

_Bool golf_level_save(golf_level_t *level,char *path)

{
  float fVar1;
  undefined8 uVar2;
  vec2 v;
  uint uVar3;
  golf_material_t *pgVar4;
  golf_lightmap_image_t *pgVar5;
  int iVar6;
  golf_entity_type_t gVar7;
  JSON_Array *pJVar8;
  JSON_Value *pJVar9;
  JSON_Object *pJVar10;
  JSON_Value *pJVar11;
  JSON_Array *pJVar12;
  JSON_Value *value;
  JSON_Array *array;
  JSON_Value *value_00;
  JSON_Object *pJVar13;
  golf_transform_t *pgVar14;
  golf_lightmap_section_t *string;
  long lVar15;
  long lVar16;
  char *pcVar17;
  int s;
  long lVar18;
  int i_3;
  int i_1;
  int i;
  int iVar19;
  long lVar20;
  golf_entity_t *pgVar21;
  int i_5;
  float fVar22;
  double number;
  vec4 v_00;
  vec3 v_01;
  vec3 v_02;
  char *local_178;
  int aiStack_170 [2];
  char *local_168;
  char *local_158;
  int aiStack_150 [2];
  char *local_148;
  JSON_Object *local_138;
  long local_130;
  vec_str_t local_128;
  JSON_Value *local_110;
  JSON_Value *local_108;
  JSON_Value *local_100;
  char *local_f8;
  JSON_Value *local_f0;
  JSON_Object *local_e8;
  JSON_Array *local_e0;
  JSON_Value *local_d8;
  JSON_Value *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  char *local_b8;
  long local_80;
  int local_78;
  uint local_68;
  long local_60;
  vec3 local_44;
  undefined8 uVar23;
  
  local_128.data = (char **)0x0;
  local_128.length = 0;
  local_128.capacity = 0;
  local_128.alloc_category = "level";
  local_f8 = path;
  _add_dependency(&local_128,"data/textures/hole_lightmap.png");
  local_100 = json_value_init_array();
  pJVar8 = json_value_get_array(local_100);
  lVar18 = 0x58;
  for (lVar20 = 0; lVar20 < (level->materials).length; lVar20 = lVar20 + 1) {
    pgVar4 = (level->materials).data;
    if (pgVar4->name[lVar18 + -0x59] != '\x01') goto LAB_0012b30c;
    pJVar9 = json_value_init_object();
    pJVar10 = json_value_get_object(pJVar9);
    json_object_set_string(pJVar10,"name",pgVar4->name + lVar18 + -0x58);
    json_object_set_number(pJVar10,"friction",(double)*(float *)(pgVar4->name + lVar18 + -0x15));
    json_object_set_number(pJVar10,"restitution",(double)*(float *)(pgVar4->name + lVar18 + -0x11));
    json_object_set_number(pJVar10,"vel_scale",(double)*(float *)(pgVar4->name + lVar18 + -0xd));
    switch(*(undefined4 *)(pgVar4->name + lVar18 + -9)) {
    case 0:
      json_object_set_string(pJVar10,"type","texture");
      break;
    case 1:
      json_object_set_string(pJVar10,"type","color");
      uVar2 = *(undefined8 *)(pgVar4->name + lVar18 + -1);
      uVar23 = *(undefined8 *)(pgVar4->name + lVar18 + 7);
      goto LAB_0012b2f5;
    case 2:
      json_object_set_string(pJVar10,"type","diffuse_color");
      uVar2 = *(undefined8 *)(pgVar4->name + lVar18 + -1);
      uVar23 = *(undefined8 *)(pgVar4->name + lVar18 + 7);
LAB_0012b2f5:
      v_00.z = (float)(int)uVar23;
      v_00.w = (float)(int)((ulong)uVar23 >> 0x20);
      v_00.x = (float)(int)uVar2;
      v_00.y = (float)(int)((ulong)uVar2 >> 0x20);
      golf_json_object_set_vec4(pJVar10,"color",v_00);
      goto switchD_0012b235_default;
    case 3:
      json_object_set_string(pJVar10,"type","environment");
      break;
    default:
      goto switchD_0012b235_default;
    }
    json_object_set_string(pJVar10,"texture",pgVar4->name + lVar18 + -1);
    _add_dependency(&local_128,pgVar4->name + lVar18 + -1);
switchD_0012b235_default:
    json_array_append_value(pJVar8,pJVar9);
LAB_0012b30c:
    lVar18 = lVar18 + 0x460;
  }
  local_108 = json_value_init_array();
  pJVar8 = json_value_get_array(local_108);
  for (lVar18 = 0; lVar18 < (level->lightmap_images).length; lVar18 = lVar18 + 1) {
    pgVar5 = (level->lightmap_images).data;
    if (pgVar5[lVar18].active == true) {
      pJVar9 = json_value_init_object();
      pJVar10 = json_value_get_object(pJVar9);
      json_object_set_string(pJVar10,"name",pgVar5[lVar18].name);
      json_object_set_number(pJVar10,"resolution",(double)pgVar5[lVar18].resolution);
      json_object_set_number(pJVar10,"time_length",(double)pgVar5[lVar18].time_length);
      json_object_set_number(pJVar10,"num_samples",(double)pgVar5[lVar18].num_samples);
      json_object_set_boolean(pJVar10,"repeats",(uint)pgVar5[lVar18].repeats);
      pJVar11 = json_value_init_array();
      pJVar12 = json_value_get_array(pJVar11);
      for (lVar20 = 0; lVar20 < pgVar5[lVar18].num_samples; lVar20 = lVar20 + 1) {
        local_c8 = (uchar *)0x0;
        uStack_c0 = 0;
        local_b8 = "level";
        stbi_write_png_to_func
                  (_stbi_write_func,&local_c8,pgVar5[lVar18].width,pgVar5[lVar18].height,1,
                   pgVar5[lVar18].data[lVar20],pgVar5[lVar18].width);
        golf_json_array_append_data(pJVar12,local_c8,(int)uStack_c0);
        golf_free_tracked(local_c8);
      }
      json_object_set_value(pJVar10,"datas",pJVar11);
      json_array_append_value(pJVar8,pJVar9);
    }
  }
  local_158 = (char *)0x0;
  aiStack_150[0] = 0;
  aiStack_150[1] = 0;
  local_148 = "level";
  lVar18 = 0;
  iVar19 = 0;
  for (lVar20 = 0; lVar20 < (level->entities).length; lVar20 = lVar20 + 1) {
    iVar6 = vec_expand_(&local_158,aiStack_150,aiStack_150 + 1,4,local_148);
    if (iVar6 == 0) {
      lVar15 = (long)aiStack_150[0];
      aiStack_150[0] = aiStack_150[0] + 1;
      *(int *)(local_158 + lVar15 * 4) = iVar19;
    }
    iVar19 = iVar19 + (uint)(byte)((level->entities).data)->name[lVar18 + -0xc];
    lVar18 = lVar18 + 0x510;
  }
  local_110 = json_value_init_array();
  local_e0 = json_value_get_array(local_110);
  lVar18 = 0;
  do {
    if ((level->entities).length <= lVar18) {
      golf_free_tracked(local_158);
      pJVar9 = json_value_init_array();
      pJVar8 = json_value_get_array(pJVar9);
      for (lVar18 = 0; lVar18 < local_128.length; lVar18 = lVar18 + 1) {
        json_array_append_string(pJVar8,local_128.data[lVar18]);
      }
      golf_free_tracked(local_128.data);
      pJVar11 = json_value_init_object();
      pJVar10 = json_value_get_object(pJVar11);
      json_object_set_value(pJVar10,"data_dependencies",pJVar9);
      json_object_set_value(pJVar10,"materials",local_100);
      json_object_set_value(pJVar10,"lightmap_images",local_108);
      json_object_set_value(pJVar10,"entities",local_110);
      json_serialize_to_file_pretty(pJVar11,local_f8);
      json_value_free(pJVar11);
      return true;
    }
    pgVar21 = (level->entities).data;
    if (pgVar21[lVar18].active != true) goto LAB_0012bfde;
    pgVar21 = pgVar21 + lVar18;
    local_d0 = json_value_init_object();
    pJVar10 = json_value_get_object(local_d0);
    iVar19 = pgVar21->parent_idx;
    if (-1 < (long)iVar19) {
      iVar19 = *(int *)(local_158 + (long)iVar19 * 4);
    }
    json_object_set_number(pJVar10,"parent_idx",(double)iVar19);
    json_object_set_string(pJVar10,"name",pgVar21->name);
    gVar7 = pgVar21->type;
    switch(gVar7) {
    case MODEL_ENTITY:
      json_object_set_string(pJVar10,"type","model");
      pcVar17 = (pgVar21->field_4).model.model_path;
      json_object_set_string(pJVar10,"model",pcVar17);
      json_object_set_number(pJVar10,"uv_scale",(double)(pgVar21->field_4).model.uv_scale);
      json_object_set_boolean
                (pJVar10,"ignore_physics",(uint)(pgVar21->field_4).model.ignore_physics);
      _add_dependency(&local_128,pcVar17);
      goto LAB_0012b719;
    case BALL_START_ENTITY:
      pcVar17 = "ball-start";
      break;
    case HOLE_ENTITY:
      pcVar17 = "hole";
      break;
    case GEO_ENTITY:
      pcVar17 = "geo";
      break;
    case WATER_ENTITY:
      pcVar17 = "water";
      break;
    case GROUP_ENTITY:
      pcVar17 = "group";
      break;
    case BEGIN_ANIMATION_ENTITY:
      pcVar17 = "begin_animation";
      break;
    case CAMERA_ZONE_ENTITY:
      json_object_set_string(pJVar10,"type","camera_zone");
      json_object_set_boolean
                (pJVar10,"towards_hole",
                 (uint)(byte)(pgVar21->field_4).geo.lightmap_section.lightmap_name[0]);
      goto LAB_0012b719;
    default:
      goto switchD_0012b5f5_default;
    }
    json_object_set_string(pJVar10,"type",pcVar17);
LAB_0012b719:
    gVar7 = pgVar21->type;
switchD_0012b5f5_default:
    if (gVar7 == GEO_ENTITY) {
      lVar20 = 0x100;
LAB_0012b75b:
      local_138 = pJVar10;
      local_130 = lVar18;
      local_d8 = json_value_init_object();
      pJVar10 = json_value_get_object(local_d8);
      local_178 = (char *)0x0;
      aiStack_170[0] = 0;
      aiStack_170[1] = 0;
      local_168 = "geo";
      lVar18 = 0;
      iVar19 = 0;
      for (lVar15 = 0; lVar15 < *(int *)(pgVar21->name + lVar20 + 0x1c); lVar15 = lVar15 + 1) {
        iVar6 = vec_expand_(&local_178,aiStack_170,aiStack_170 + 1,4,local_168);
        if (iVar6 == 0) {
          lVar16 = (long)aiStack_170[0];
          aiStack_170[0] = aiStack_170[0] + 1;
          *(int *)(local_178 + lVar16 * 4) = iVar19;
        }
        iVar19 = iVar19 + (~*(uint *)(*(long *)(pgVar21->name + lVar20 + 0x14) + lVar18) & 1);
        lVar18 = lVar18 + 0x10;
      }
      pJVar9 = json_value_init_array();
      pJVar8 = json_value_get_array(pJVar9);
      lVar18 = 0xc;
      for (lVar15 = 0; lVar15 < *(int *)(pgVar21->name + lVar20 + 0x1c); lVar15 = lVar15 + 1) {
        lVar16 = *(long *)(pgVar21->name + lVar20 + 0x14);
        if ((*(byte *)(lVar16 + -0xc + lVar18) & 1) != 0) {
          fVar22 = *(float *)(lVar16 + -4 + lVar18);
          fVar1 = *(float *)(lVar16 + lVar18);
          json_array_append_number(pJVar8,(double)*(float *)(lVar16 + -8 + lVar18));
          json_array_append_number(pJVar8,(double)fVar22);
          json_array_append_number(pJVar8,(double)fVar1);
        }
        lVar18 = lVar18 + 0x10;
      }
      json_object_set_value(pJVar10,"p",pJVar9);
      pJVar9 = json_value_init_array();
      pJVar8 = json_value_get_array(pJVar9);
      for (lVar18 = 0; lVar18 < *(int *)(pgVar21->name + lVar20 + 0x34); lVar18 = lVar18 + 1) {
        memcpy(&local_c8,(void *)(lVar18 * 0x90 + *(long *)(pgVar21->name + lVar20 + 0x2c)),0x90);
        if ((char)local_c8 == '\x01') {
          pJVar11 = json_value_init_array();
          pJVar12 = json_value_get_array(pJVar11);
          value = json_value_init_array();
          array = json_value_get_array(value);
          for (lVar15 = 0; lVar15 < local_78; lVar15 = lVar15 + 1) {
            iVar19 = *(int *)(local_80 + lVar15 * 4);
            json_array_append_number
                      (pJVar12,(double)(iVar19 - *(int *)(local_178 + (long)iVar19 * 4)));
            fVar22 = *(float *)(local_60 + 4 + lVar15 * 8);
            json_array_append_number(array,(double)*(float *)(local_60 + lVar15 * 8));
            json_array_append_number(array,(double)fVar22);
          }
          value_00 = json_value_init_object();
          pJVar13 = json_value_get_object(value_00);
          json_object_set_string(pJVar13,"material_name",(char *)((long)&local_c8 + 1));
          json_object_set_value(pJVar13,"idxs",pJVar11);
          json_object_set_value(pJVar13,"uvs",value);
          json_object_set_string(pJVar13,"uv_gen_type",_golf_geo_face_uv_gen_type_strings[local_68])
          ;
          json_array_append_value(pJVar8,value_00);
          golf_json_object_set_vec3(pJVar13,"water_dir",local_44);
        }
      }
      json_object_set_value(pJVar10,"faces",pJVar9);
      if (*(long *)(pgVar21->name + lVar20 + -0xc) != 0) {
        pJVar9 = json_value_init_object();
        local_e8 = json_value_get_object(pJVar9);
        json_object_set_string(local_e8,"script",*(char **)(pgVar21->name + lVar20 + -0xc));
        local_f0 = json_value_init_array();
        pJVar8 = json_value_get_array(local_f0);
        lVar18 = 0;
        for (lVar15 = 0; lVar15 < *(int *)(pgVar21->name + lVar20 + 4); lVar15 = lVar15 + 1) {
          pJVar11 = json_value_init_object();
          pJVar13 = json_value_get_object(pJVar11);
          json_object_set_string
                    (pJVar13,"name",(char *)(*(long *)(pgVar21->name + lVar20 + -4) + lVar18));
          lVar16 = *(long *)(pgVar21->name + lVar20 + -4);
          uVar3 = *(uint *)(lVar16 + 0x40 + lVar18);
          if (0xb < uVar3) goto LAB_0012bbce;
          v = *(vec2 *)(lVar16 + 0x48 + lVar18);
          fVar22 = v.x;
          switch(uVar3) {
          default:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/common/level.c"
                          ,0x1ae,
                          "void _golf_json_object_set_geo(JSON_Object *, const char *, golf_geo_t *)"
                         );
          case 1:
            json_object_set_string(pJVar13,"type","bool");
            fVar22 = (float)((uint)fVar22 & 1);
            goto LAB_0012bbba;
          case 2:
            json_object_set_string(pJVar13,"type","int");
LAB_0012bbba:
            number = (double)(int)fVar22;
LAB_0012bbbf:
            json_object_set_number(pJVar13,"val",number);
            break;
          case 3:
            json_object_set_string(pJVar13,"type","float");
            number = (double)fVar22;
            goto LAB_0012bbbf;
          case 4:
            json_object_set_string(pJVar13,"type","vec2");
            golf_json_object_set_vec2(pJVar13,"val",v);
            break;
          case 5:
            fVar22 = *(float *)(lVar16 + 0x50 + lVar18);
            json_object_set_string(pJVar13,"type","vec3");
            v_01.z = fVar22;
            v_01.x = v.x;
            v_01.y = v.y;
            golf_json_object_set_vec3(pJVar13,"val",v_01);
          }
LAB_0012bbce:
          json_array_append_value(pJVar8,pJVar11);
          lVar18 = lVar18 + 0x58;
        }
        json_object_set_value(local_e8,"args",local_f0);
        json_object_set_value(pJVar10,"generator_data",pJVar9);
      }
      pJVar10 = local_138;
      json_object_set_value(local_138,"geo",local_d8);
      golf_free_tracked(local_178);
      lVar18 = local_130;
    }
    else if (gVar7 == WATER_ENTITY) {
      lVar20 = 0xd8;
      goto LAB_0012b75b;
    }
    pgVar14 = golf_entity_get_transform(pgVar21);
    if (pgVar14 != (golf_transform_t *)0x0) {
      pJVar9 = json_value_init_object();
      pJVar13 = json_value_get_object(pJVar9);
      golf_json_object_set_vec3(pJVar13,"position",pgVar14->position);
      golf_json_object_set_vec3(pJVar13,"scale",pgVar14->scale);
      golf_json_object_set_quat(pJVar13,"rotation",pgVar14->rotation);
      json_object_set_value(pJVar10,"transform",pJVar9);
    }
    string = golf_entity_get_lightmap_section(pgVar21);
    if (string != (golf_lightmap_section_t *)0x0) {
      pJVar9 = json_value_init_object();
      pJVar13 = json_value_get_object(pJVar9);
      json_object_set_string(pJVar13,"lightmap_name",string->lightmap_name);
      golf_json_object_set_float_array
                (pJVar13,"uvs",&((string->uvs).data)->x,(string->uvs).length * 2,0.0,1.0);
      json_object_set_value(pJVar10,"lightmap_section",pJVar9);
    }
    if ((pgVar21->type != GEO_ENTITY) && (pgVar21->type != MODEL_ENTITY)) goto LAB_0012bfc4;
    pJVar9 = json_value_init_object();
    pJVar13 = json_value_get_object(pJVar9);
    switch((pgVar21->field_4).model.movement.type) {
    case GOLF_MOVEMENT_NONE:
      json_object_set_string(pJVar13,"type","none");
      break;
    case GOLF_MOVEMENT_LINEAR:
      json_object_set_string(pJVar13,"type","linear");
      json_object_set_number(pJVar13,"t0",(double)*(float *)((long)&pgVar21->field_4 + 0x90));
      json_object_set_number(pJVar13,"length",(double)*(float *)((long)&pgVar21->field_4 + 0x94));
      golf_json_object_set_vec3(pJVar13,"p0",*(vec3 *)((long)&pgVar21->field_4 + 0x98));
      uVar23 = *(undefined8 *)
                ((long)&(pgVar21->field_4).water.geo.generator_data.args.alloc_category + 4);
      fVar22 = (pgVar21->field_4).model.movement.field_4.linear.p1.z;
      pcVar17 = "p1";
      goto LAB_0012bfad;
    case GOLF_MOVEMENT_SPINNER:
      json_object_set_string(pJVar13,"type","spinner");
      json_object_set_number(pJVar13,"t0",(double)*(float *)((long)&pgVar21->field_4 + 0x90));
      json_object_set_number(pJVar13,"length",(double)*(float *)((long)&pgVar21->field_4 + 0x94));
      break;
    case GOLF_MOVEMENT_PENDULUM:
      json_object_set_string(pJVar13,"type","pendulum");
      json_object_set_number(pJVar13,"t0",(double)*(float *)((long)&pgVar21->field_4 + 0x90));
      json_object_set_number(pJVar13,"length",(double)*(float *)((long)&pgVar21->field_4 + 0x94));
      json_object_set_number(pJVar13,"theta0",(double)*(float *)((long)&pgVar21->field_4 + 0x98));
      uVar23 = *(undefined8 *)&(pgVar21->field_4).water.geo.generator_data.args.capacity;
      fVar22 = (pgVar21->field_4).model.movement.field_4.linear.p1.x;
      goto LAB_0012bf16;
    case GOLF_MOVEMENT_RAMP:
      json_object_set_string(pJVar13,"type","ramp");
      json_object_set_number(pJVar13,"t0",(double)*(float *)((long)&pgVar21->field_4 + 0x90));
      json_object_set_number(pJVar13,"length",(double)*(float *)((long)&pgVar21->field_4 + 0x94));
      json_object_set_number(pJVar13,"theta0",(double)*(float *)((long)&pgVar21->field_4 + 0x98));
      json_object_set_number(pJVar13,"theta1",(double)*(float *)((long)&pgVar21->field_4 + 0x9c));
      json_object_set_number
                (pJVar13,"transition_length",(double)*(float *)((long)&pgVar21->field_4 + 0xa0));
      uVar23 = *(undefined8 *)
                ((long)&(pgVar21->field_4).water.geo.generator_data.args.alloc_category + 4);
      fVar22 = (pgVar21->field_4).model.movement.field_4.linear.p1.z;
LAB_0012bf16:
      pcVar17 = "axis";
LAB_0012bfad:
      v_02.z = fVar22;
      v_02.x = (float)(int)uVar23;
      v_02.y = (float)(int)((ulong)uVar23 >> 0x20);
      golf_json_object_set_vec3(pJVar13,pcVar17,v_02);
    }
    json_object_set_value(pJVar10,"movement",pJVar9);
LAB_0012bfc4:
    json_array_append_value(local_e0,local_d0);
LAB_0012bfde:
    lVar18 = lVar18 + 1;
  } while( true );
}

Assistant:

bool golf_level_save(golf_level_t *level, const char *path) {
    vec_str_t data_dependencies;
    vec_init(&data_dependencies, "level");
    _add_dependency(&data_dependencies, "data/textures/hole_lightmap.png");

    JSON_Value *json_materials_val = json_value_init_array();
    JSON_Array *json_materials_arr = json_value_get_array(json_materials_val);
    for (int i = 0; i < level->materials.length; i++) {
        golf_material_t *material = &level->materials.data[i];
        if (!material->active) continue;

        JSON_Value *json_material_val = json_value_init_object();
        JSON_Object *json_material_obj = json_value_get_object(json_material_val);
        json_object_set_string(json_material_obj, "name", material->name);
        json_object_set_number(json_material_obj, "friction", material->friction);
        json_object_set_number(json_material_obj, "restitution", material->restitution);
        json_object_set_number(json_material_obj, "vel_scale", material->vel_scale);

        switch (material->type) {
            case GOLF_MATERIAL_TEXTURE: {
                json_object_set_string(json_material_obj, "type", "texture");
                json_object_set_string(json_material_obj, "texture", material->texture_path);
                _add_dependency(&data_dependencies, material->texture_path);
                break;
            }
            case GOLF_MATERIAL_COLOR: {
                json_object_set_string(json_material_obj, "type", "color");
                golf_json_object_set_vec4(json_material_obj, "color", material->color);
                break;
            }
            case GOLF_MATERIAL_DIFFUSE_COLOR: {
                json_object_set_string(json_material_obj, "type", "diffuse_color");
                golf_json_object_set_vec4(json_material_obj, "color", material->color);
                break;
            }
            case GOLF_MATERIAL_ENVIRONMENT: {
                json_object_set_string(json_material_obj, "type", "environment");
                json_object_set_string(json_material_obj, "texture", material->texture_path);
                _add_dependency(&data_dependencies, material->texture_path);
                break;
            }
        }

        json_array_append_value(json_materials_arr, json_material_val);
    }

    JSON_Value *json_lightmap_images_val = json_value_init_array();
    JSON_Array *json_lightmap_images_arr = json_value_get_array(json_lightmap_images_val);
    for (int i = 0; i < level->lightmap_images.length; i++) {
        golf_lightmap_image_t *lightmap_image = &level->lightmap_images.data[i];
        if (!lightmap_image->active) continue;

        JSON_Value *json_lightmap_image_val = json_value_init_object();
        JSON_Object *json_lightmap_image_obj = json_value_get_object(json_lightmap_image_val);
        json_object_set_string(json_lightmap_image_obj, "name", lightmap_image->name);
        json_object_set_number(json_lightmap_image_obj, "resolution", lightmap_image->resolution);
        json_object_set_number(json_lightmap_image_obj, "time_length", lightmap_image->time_length);
        json_object_set_number(json_lightmap_image_obj, "num_samples", lightmap_image->num_samples);
        json_object_set_boolean(json_lightmap_image_obj, "repeats", lightmap_image->repeats);

        JSON_Value *datas_val = json_value_init_array();
        JSON_Array *datas_arr = json_value_get_array(datas_val);
        for (int s = 0; s < lightmap_image->num_samples; s++) {
            vec_char_t png_data;
            vec_init(&png_data, "level");
            stbi_write_png_to_func(_stbi_write_func, &png_data, lightmap_image->width, lightmap_image->height, 1, lightmap_image->data[s], lightmap_image->width);
            golf_json_array_append_data(datas_arr, (unsigned char*)png_data.data, sizeof(unsigned char) * png_data.length);
            vec_deinit(&png_data);
        }
        json_object_set_value(json_lightmap_image_obj, "datas", datas_val);

        json_array_append_value(json_lightmap_images_arr, json_lightmap_image_val);
    }

    vec_int_t entity_saved_idx;
    vec_init(&entity_saved_idx, "level");
    {
        int saved_idx = 0;
        for (int i = 0; i < level->entities.length; i++) {
            vec_push(&entity_saved_idx, saved_idx);
            if (level->entities.data[i].active) saved_idx++;
        }
    }

    JSON_Value *json_entities_val = json_value_init_array();
    JSON_Array *json_entities_arr = json_value_get_array(json_entities_val);
    for (int i = 0; i < level->entities.length; i++) {
        golf_entity_t *entity = &level->entities.data[i];
        if (!entity->active) continue;

        JSON_Value *json_entity_val = json_value_init_object();
        JSON_Object *json_entity_obj = json_value_get_object(json_entity_val);

        int parent_idx = entity->parent_idx;
        if (parent_idx >= 0) {
            parent_idx = entity_saved_idx.data[parent_idx];
        }
        json_object_set_number(json_entity_obj, "parent_idx", parent_idx);
        json_object_set_string(json_entity_obj, "name", entity->name);
        switch (entity->type) {
            case MODEL_ENTITY: {
                golf_model_entity_t *model = &entity->model;
                json_object_set_string(json_entity_obj, "type", "model");
                json_object_set_string(json_entity_obj, "model", model->model_path);
                json_object_set_number(json_entity_obj, "uv_scale", model->uv_scale);
                json_object_set_boolean(json_entity_obj, "ignore_physics", model->ignore_physics);
                _add_dependency(&data_dependencies, model->model_path);
                break;
            }
            case BALL_START_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "ball-start");
                break;
            }
            case HOLE_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "hole");
                break;
            }
            case GEO_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "geo");
                break;
            }
            case GROUP_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "group");
                break;
            }
            case WATER_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "water");
                break;
            }
            case BEGIN_ANIMATION_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "begin_animation");
                break;
            }
            case CAMERA_ZONE_ENTITY: {
                json_object_set_string(json_entity_obj, "type", "camera_zone");
                json_object_set_boolean(json_entity_obj, "towards_hole", entity->camera_zone.towards_hole);
                break;
            }
        }

        golf_geo_t *geo = golf_entity_get_geo(entity);
        if (geo) {
            _golf_json_object_set_geo(json_entity_obj, "geo", geo);
        }

        golf_transform_t *transform = golf_entity_get_transform(entity);
        if (transform) {
            _golf_json_object_set_transform(json_entity_obj, "transform", transform);
        }

        golf_lightmap_section_t *lightmap_section = golf_entity_get_lightmap_section(entity);
        if (lightmap_section) {
            _golf_json_object_set_lightmap_section(json_entity_obj, "lightmap_section", lightmap_section);
        }

        golf_movement_t *movement = golf_entity_get_movement(entity);
        if (movement) {
            _golf_json_object_set_movement(json_entity_obj, "movement", movement);
        }

        json_array_append_value(json_entities_arr, json_entity_val);
    }

    vec_deinit(&entity_saved_idx);

    JSON_Value *json_data_dependencies_val = json_value_init_array();
    JSON_Array *json_data_dependencies_arr = json_value_get_array(json_data_dependencies_val);
    for (int i = 0; i < data_dependencies.length; i++) {
        json_array_append_string(json_data_dependencies_arr, data_dependencies.data[i]);
    }
    vec_deinit(&data_dependencies);

    JSON_Value *json_val = json_value_init_object();
    JSON_Object *json_obj = json_value_get_object(json_val);
    json_object_set_value(json_obj, "data_dependencies", json_data_dependencies_val);
    json_object_set_value(json_obj, "materials", json_materials_val);
    json_object_set_value(json_obj, "lightmap_images", json_lightmap_images_val);
    json_object_set_value(json_obj, "entities", json_entities_val);
    json_serialize_to_file_pretty(json_val, path);
    json_value_free(json_val);
    return true;
}